

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::timestamp_t,duckdb::date_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool,false,true>
               (string_t *ldata,timestamp_t *rdata,date_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  int64_t iVar2;
  date_t dVar3;
  ulong uVar4;
  timestamp_t tVar5;
  char **ppcVar6;
  ulong uVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  string_t specifier;
  string_t specifier_00;
  string_t specifier_01;
  char **local_68;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar2 = rdata->value;
      local_68 = &(ldata->value).pointer.ptr;
      iVar8 = 0;
      tVar5.value = count;
      do {
        specifier_01.value.pointer.ptr = (char *)iVar2;
        specifier_01.value._0_8_ = *local_68;
        dVar3 = DateTruncBinaryOperator::
                Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::date_t>
                          (*(DateTruncBinaryOperator **)(local_68 + -1),specifier_01,tVar5);
        result_data[iVar8].days = dVar3.days;
        iVar8 = iVar8 + 1;
        local_68 = local_68 + 2;
      } while (count != iVar8);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar4 = 0;
    uVar10 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar9 = 0xffffffffffffffff;
      }
      else {
        uVar9 = puVar1[uVar4];
      }
      uVar11 = uVar10 + 0x40;
      if (count <= uVar10 + 0x40) {
        uVar11 = count;
      }
      uVar7 = uVar11;
      if (uVar9 != 0) {
        uVar7 = uVar10;
        if (uVar9 == 0xffffffffffffffff) {
          if (uVar10 < uVar11) {
            iVar2 = rdata->value;
            ppcVar6 = &ldata[uVar10].value.pointer.ptr;
            tVar5.value = uVar4;
            do {
              specifier.value.pointer.ptr = (char *)iVar2;
              specifier.value._0_8_ = *ppcVar6;
              dVar3 = DateTruncBinaryOperator::
                      Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::date_t>
                                (*(DateTruncBinaryOperator **)(ppcVar6 + -1),specifier,tVar5);
              result_data[uVar10].days = dVar3.days;
              uVar10 = uVar10 + 1;
              ppcVar6 = ppcVar6 + 2;
              uVar7 = uVar10;
            } while (uVar11 != uVar10);
          }
        }
        else if (uVar10 < uVar11) {
          ppcVar6 = &ldata[uVar10].value.pointer.ptr;
          uVar7 = 0;
          tVar5.value = uVar4;
          do {
            if ((uVar9 >> (uVar7 & 0x3f) & 1) != 0) {
              specifier_00.value.pointer.ptr = (char *)rdata->value;
              specifier_00.value._0_8_ = *ppcVar6;
              dVar3 = DateTruncBinaryOperator::
                      Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::date_t>
                                (*(DateTruncBinaryOperator **)(ppcVar6 + -1),specifier_00,tVar5);
              result_data[uVar10 + uVar7].days = dVar3.days;
            }
            uVar7 = uVar7 + 1;
            ppcVar6 = ppcVar6 + 2;
          } while ((uVar10 - uVar11) + uVar7 != 0);
          uVar7 = uVar10 + uVar7;
        }
      }
      uVar4 = uVar4 + 1;
      uVar10 = uVar7;
    } while (uVar4 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}